

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_bool>
 __thiscall
perfetto::base::FlatSet<unsigned_long>::insert(FlatSet<unsigned_long> *this,unsigned_long value)

{
  bool bVar1;
  reference puVar2;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_bool>
  pVar3;
  bool local_71;
  const_iterator local_70;
  unsigned_long *local_68;
  bool local_49;
  unsigned_long *local_48;
  unsigned_long *local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  iterator entries_end;
  unsigned_long value_local;
  FlatSet<unsigned_long> *this_local;
  undefined1 local_10;
  
  entries_end._M_current = (unsigned_long *)value;
  it._M_current =
       (unsigned_long *)
       ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->entries_);
  local_40 = (unsigned_long *)
             ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->entries_);
  local_48 = it._M_current;
  local_38 = ::std::
             lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )local_40,it,(unsigned_long *)&entries_end);
  bVar1 = __gnu_cxx::operator!=(&local_38,&it);
  if ((bVar1) &&
     (puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_38), (unsigned_long *)*puVar2 == entries_end._M_current)) {
    local_49 = false;
    pVar3 = ::std::
            make_pair<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,bool>
                      (&local_38,&local_49);
    local_10 = pVar3.second;
  }
  else {
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_70,&local_38);
    local_68 = (unsigned_long *)
               ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
                         (&this->entries_,local_70,(value_type_conflict1 *)&entries_end);
    local_71 = true;
    local_38._M_current = local_68;
    pVar3 = ::std::
            make_pair<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>&,bool>
                      (&local_38,&local_71);
    local_10 = pVar3.second;
  }
  this_local = (FlatSet<unsigned_long> *)pVar3.first._M_current;
  pVar3.second = (bool)local_10;
  pVar3.first._M_current = (unsigned_long *)this_local;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(T value) {
    auto entries_end = entries_.end();
    auto it = std::lower_bound(entries_.begin(), entries_end, value);
    if (it != entries_end && *it == value)
      return std::make_pair(it, false);
    // If the value is not found |it| is either end() or the next item strictly
    // greater than |value|. In both cases we want to insert just before that.
    it = entries_.insert(it, std::move(value));
    return std::make_pair(it, true);
  }